

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

int do_bind(s_SocketStuff *s)

{
  ushort uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  int *piVar5;
  undefined1 local_128 [6];
  uint16_t original_listen_port;
  char errorBuffer [256];
  int errCode;
  int bind_error;
  int ret_val;
  s_SocketStuff *s_local;
  
  errorBuffer[0xfc] = '\0';
  errorBuffer[0xfd] = '\0';
  errorBuffer[0xfe] = '\0';
  errorBuffer[0xff] = '\0';
  uVar1 = s->try_port;
  do {
    if (s->ip_version == 4) {
      uVar3 = s->try_port;
      s->try_port = uVar3 + 1;
      uVar3 = htons(uVar3);
      ((s->field_3).serverAddr4)->sin_port = uVar3;
    }
    else if (s->ip_version == 6) {
      uVar3 = s->try_port;
      s->try_port = uVar3 + 1;
      uVar3 = htons(uVar3);
      ((s->field_3).serverAddr4)->sin_port = uVar3;
    }
    iVar4 = bind(s->fd,(sockaddr *)(s->field_3).serverAddr,s->address_len);
    if (iVar4 == -1) {
      piVar5 = __errno_location();
      errorBuffer._252_4_ = *piVar5;
      piVar5 = __errno_location();
      if (*piVar5 == 0x62) {
        errorBuffer[0xfc] = '\x01';
        errorBuffer[0xfd] = '\0';
        errorBuffer[0xfe] = '\0';
        errorBuffer[0xff] = '\0';
      }
    }
    else {
      errorBuffer[0xfc] = '\0';
      errorBuffer[0xfd] = '\0';
      errorBuffer[0xfe] = '\0';
      errorBuffer[0xff] = '\0';
    }
    bVar2 = false;
    if (errorBuffer._252_4_ != 0) {
      bVar2 = uVar1 <= s->try_port;
    }
  } while (bVar2);
  if (iVar4 == -1) {
    piVar5 = __errno_location();
    __xpg_strerror_r(*piVar5,local_128,0x100);
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x380,
               "get_miniserver_sockets: Error in IPv%d bind(): %s\n",(ulong)(uint)s->ip_version,
               local_128);
    s_local._4_4_ = -0xcb;
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int do_bind(struct s_SocketStuff *s)
{
	int ret_val = UPNP_E_SUCCESS;
	int bind_error;
	int errCode = 0;
	char errorBuffer[ERROR_BUFFER_LEN];
	uint16_t original_listen_port = s->try_port;

	do {
		switch (s->ip_version) {
		case 4:
			s->serverAddr4->sin_port = htons(s->try_port++);
			break;
		case 6:
			s->serverAddr6->sin6_port = htons(s->try_port++);
			break;
		}
		bind_error = bind(s->fd, s->serverAddr, s->address_len);
		if (bind_error == SOCKET_ERROR) {
		#ifdef _WIN32
			errCode = WSAGetLastError();
		#else
			errCode = errno;
		#endif
			if (errno == EADDRINUSE) {
				errCode = 1;
			}
		} else {
			errCode = 0;
		}
	} while (errCode != 0 && s->try_port >= original_listen_port);
	if (bind_error == SOCKET_ERROR) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_INFO,
			MSERV,
			__FILE__,
			__LINE__,
			"get_miniserver_sockets: "
			"Error in IPv%d bind(): %s\n",
			s->ip_version,
			errorBuffer);
		/* Bind failied. */
		ret_val = UPNP_E_SOCKET_BIND;
		goto error;
	}

	return UPNP_E_SUCCESS;

error:
	return ret_val;
}